

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

void __thiscall BVStatic<256UL>::And(BVStatic<256UL> *this,BVStatic<256UL> *bv)

{
  ulong *puVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    puVar1 = (ulong *)((long)&this->data[0].word + lVar2);
    *puVar1 = *puVar1 & *(ulong *)((long)&bv->data[0].word + lVar2);
  }
  return;
}

Assistant:

void And(const BVStatic *bv) { this->for_each(bv, &BVUnit::And); }